

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mjs::interpreter::impl::scope::put_local(scope *this,string *key,value *val)

{
  bool bVar1;
  property_attribute a;
  object *poVar2;
  scope *this_00;
  bool local_69;
  wstring_view local_50 [2];
  undefined1 local_30 [8];
  gc_heap_ptr<mjs::object> act;
  value *val_local;
  string *key_local;
  scope *this_local;
  
  act.super_gc_heap_ptr_untyped._8_8_ = val;
  gc_heap_ptr_untracked<mjs::object,_true>::track
            ((gc_heap_ptr_untracked<mjs::object,_true> *)local_30,(gc_heap *)&this->activation_);
  bVar1 = gc_heap_ptr_untyped::has_type<mjs::activation_object>((gc_heap_ptr_untyped *)local_30);
  local_69 = true;
  if (!bVar1) {
    bVar1 = is_global_object((object_ptr *)local_30);
    local_69 = true;
    if (!bVar1) {
      poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
      local_50[0] = string::view(key);
      a = object::own_property_attributes(poVar2,local_50);
      local_69 = is_valid(a);
    }
  }
  if (local_69 == false) {
    bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool((gc_heap_ptr_untracked *)&this->prev_)
    ;
    if (!bVar1) {
      __assert_fail("prev_",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x48f,
                    "void mjs::interpreter::impl::scope::put_local(const string &, const value &)");
    }
    this_00 = gc_heap_ptr_untracked<mjs::interpreter::impl::scope,_true>::dereference
                        (&this->prev_,this->heap_);
    put_local(this_00,key,(value *)act.super_gc_heap_ptr_untyped._8_8_);
  }
  else {
    poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
    object::redefine_own_property
              (poVar2,key,(value *)act.super_gc_heap_ptr_untyped._8_8_,dont_delete);
  }
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_30);
  return;
}

Assistant:

void put_local(const string& key, const value& val) {
            auto act = activation_.track(heap_);
            // Hack-ish, but variable/function definitions end up in e.g. in the "with" object otherwise
            // The final check if is in the case of a variabl declaration 'shadowing' the catch identifier
            if (act.has_type<activation_object>() || is_global_object(act) || is_valid(act->own_property_attributes(key.view()))) {
                act->redefine_own_property(key, val, property_attribute::dont_delete);
            } else {
                assert(prev_);
                prev_.dereference(heap_).put_local(key, val);
            }
        }